

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

bool __thiscall
TPZMatrix<double>::SolveEigensystemJacobi
          (TPZMatrix<double> *this,int64_t *numiterations,REAL *tol,TPZVec<double> *Eigenvalues,
          TPZFMatrix<double> *Eigenvectors)

{
  double dVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  ulong row;
  bool bVar5;
  int iVar6;
  double *pdVar7;
  int64_t j;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int64_t i;
  double extraout_XMM0_Qa;
  double dVar12;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double local_448;
  double local_438;
  TPZFNMatrix<9,_double> Matrix_1;
  TPZFNMatrix<3,_double> VecIni;
  TPZFMatrix<double> local_250;
  TPZFNMatrix<3,_double> VecIni_cp;
  TPZFNMatrix<9,_double> Matrix;
  
  lVar4 = *numiterations;
  dVar1 = *tol;
  row = (this->super_TPZBaseMatrix).fRow;
  TPZFNMatrix<9,_double>::TPZFNMatrix(&Matrix,row,row);
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (long)row) {
    uVar10 = row;
  }
  for (; uVar9 != uVar10; uVar9 = uVar9 + 1) {
    for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,uVar9,uVar8);
      pdVar7 = TPZFMatrix<double>::operator()(&Matrix.super_TPZFMatrix<double>,uVar9,uVar8);
      *pdVar7 = extraout_XMM0_Qa;
    }
  }
  bVar5 = SolveEigenvaluesJacobi((TPZMatrix<double> *)&Matrix,numiterations,tol,Eigenvalues);
  if (bVar5) {
    Matrix_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<3,_double>::TPZFNMatrix(&VecIni,row,1,(double *)&Matrix_1);
    Matrix_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable = (_func_int **)0x0;
    TPZFNMatrix<3,_double>::TPZFNMatrix(&VecIni_cp,row,1,(double *)&Matrix_1);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xd])(Eigenvectors,row,row);
    (*(Eigenvectors->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
      [0xf])(Eigenvectors);
    for (uVar9 = 0; uVar9 != uVar10; uVar9 = uVar9 + 1) {
      for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = rand();
        VecIni.super_TPZFMatrix<double>.fElem[uVar8] = (double)iVar6;
      }
      TPZFMatrix<double>::TPZFMatrix(&local_250,this);
      TPZFNMatrix<9,_double>::TPZFNMatrix(&Matrix_1,&local_250);
      TPZFMatrix<double>::~TPZFMatrix(&local_250);
      dVar12 = ReturnNearestValue(Eigenvalues->fStore[uVar9],Eigenvalues,1e-05);
      dVar12 = ABS(dVar12 - Eigenvalues->fStore[uVar9]);
      if (dVar12 <= 1e-05) {
        for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar8,uVar8);
          Matrix_1.super_TPZFMatrix<double>.fElem
          [(uVar8 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
           uVar8] = extraout_XMM0_Qa_01 - (Eigenvalues->fStore[uVar9] + -0.01);
        }
      }
      else {
        for (uVar8 = 0; row != uVar8; uVar8 = uVar8 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])(this,uVar8,uVar8);
          Matrix_1.super_TPZFMatrix<double>.fElem
          [(uVar8 & 0xffffffff) *
           Matrix_1.super_TPZFMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
           uVar8] = extraout_XMM0_Qa_00 - (dVar12 * -0.01 + Eigenvalues->fStore[uVar9]);
        }
      }
      local_448 = 0.0;
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
        dVar12 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
        local_448 = local_448 + ABS(*pdVar7) * ABS(dVar12);
      }
      if (local_448 < 0.0) {
        local_448 = sqrt(local_448);
      }
      else {
        local_448 = SQRT(local_448);
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
        dVar12 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
        *pdVar7 = dVar12 / local_448;
      }
      local_438 = 10.0;
      for (lVar11 = 0; (dVar1 < local_438 && (lVar11 <= lVar4)); lVar11 = lVar11 + 1) {
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          dVar12 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni_cp.super_TPZFMatrix<double>,uVar8,0);
          *pdVar7 = dVar12;
        }
        Solve_LU((TPZMatrix<double> *)&Matrix_1,&VecIni.super_TPZFMatrix<double>);
        local_448 = 0.0;
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          dVar12 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          local_448 = local_448 + ABS(*pdVar7) * ABS(dVar12);
        }
        if (local_448 < 0.0) {
          local_448 = sqrt(local_448);
        }
        else {
          local_448 = SQRT(local_448);
        }
        local_438 = 0.0;
        for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          dVar12 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          *pdVar7 = dVar12 / local_448;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni_cp.super_TPZFMatrix<double>,uVar8,0);
          dVar12 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          dVar2 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni_cp.super_TPZFMatrix<double>,uVar8,0);
          dVar3 = *pdVar7;
          pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
          local_438 = local_438 + ABS((dVar12 - dVar2) * (dVar3 - *pdVar7));
        }
        if (local_438 < 0.0) {
          local_438 = sqrt(local_438);
        }
        else {
          local_438 = SQRT(local_438);
        }
      }
      for (uVar8 = 0; uVar10 != uVar8; uVar8 = uVar8 + 1) {
        pdVar7 = TPZFMatrix<double>::operator()(&VecIni.super_TPZFMatrix<double>,uVar8,0);
        dVar12 = *pdVar7;
        pdVar7 = TPZFMatrix<double>::operator()(Eigenvectors,uVar9,uVar8);
        *pdVar7 = (double)(~-(ulong)(ABS(dVar12) < 1e-05) & (ulong)dVar12);
      }
      TPZFNMatrix<9,_double>::~TPZFNMatrix(&Matrix_1);
    }
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&VecIni_cp);
    TPZFNMatrix<3,_double>::~TPZFNMatrix(&VecIni);
  }
  TPZFNMatrix<9,_double>::~TPZFNMatrix(&Matrix);
  return bVar5;
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}